

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

char * cram_encode_aux_1_0(cram_fd *fd,bam_seq_t *b,cram_container *c,cram_slice *s,cram_record *cr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  int64_t iVar9;
  int64_t iVar10;
  uint uVar11;
  void *pvVar12;
  char *pcVar13;
  char *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_78;
  double local_70;
  int local_64;
  uint32_t count;
  int blen;
  int type;
  int r;
  int32_t i32;
  int aux_size;
  char *rg;
  char *tmp;
  char *aux;
  cram_record *cr_local;
  cram_slice *s_local;
  cram_container *c_local;
  bam_seq_t *b_local;
  cram_fd *fd_local;
  
  _i32 = (char *)0x0;
  r = b->l_data -
      (((int)b->data + (uint)(ushort)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x30) * 4 +
        ((uint)((ulong)*(undefined8 *)&(b->core).field_0x8 >> 0x18) & 0xff) +
        ((b->core).l_qseq + 1 >> 1) + (b->core).l_qseq) - (int)b);
  aux = (char *)cr;
  cr_local = (cram_record *)s;
  s_local = (cram_slice *)c;
  c_local = (cram_container *)b;
  b_local = (bam_seq_t *)fd;
  while( true ) {
    uVar1 = *(undefined8 *)(*(long *)&cr_local[1].apos + 0x28);
    auVar17._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar17._0_8_ = uVar1;
    auVar17._12_4_ = 0x45300000;
    uVar2 = *(undefined8 *)(*(long *)&cr_local[1].apos + 0x30);
    auVar15._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar15._0_8_ = uVar2;
    auVar15._12_4_ = 0x45300000;
    if ((auVar15._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) + (double)r * 1.34 + 1.0 <
        (auVar17._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) break;
    if (*(long *)(*(long *)&cr_local[1].apos + 0x28) == 0) {
      local_70 = 1024.0;
    }
    else {
      uVar1 = *(undefined8 *)(*(long *)&cr_local[1].apos + 0x28);
      auVar16._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar16._0_8_ = uVar1;
      auVar16._12_4_ = 0x45300000;
      local_70 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
    }
    *(long *)(*(long *)&cr_local[1].apos + 0x28) =
         (long)local_70 | (long)(local_70 - 9.223372036854776e+18) & (long)local_70 >> 0x3f;
    pvVar12 = realloc(*(void **)(*(long *)&cr_local[1].apos + 0x20),
                      *(size_t *)(*(long *)&cr_local[1].apos + 0x28));
    *(void **)(*(long *)&cr_local[1].apos + 0x20) = pvVar12;
  }
  lVar5 = *(long *)(*(long *)&cr_local[1].apos + 0x20);
  lVar6 = *(long *)(*(long *)&cr_local[1].apos + 0x30);
  lVar7 = *(long *)&c_local->num_landmarks;
  uVar8 = c_local->ref_seq_span;
  uVar1._0_4_ = c_local->ref_seq_start;
  uVar1._4_4_ = c_local->ref_seq_span;
  iVar9 = c_local->record_counter;
  iVar10 = c_local->record_counter;
  *(int32_t *)(aux + 0x44) = cr_local->ncigar;
  rg = (char *)(lVar5 + lVar6);
  tmp = (char *)(lVar7 + (int)((uint)(ushort)((uint)uVar8 >> 0x10) << 2) +
                 (long)(int)((uint)((ulong)uVar1 >> 0x18) & 0xff) + (long)((int)iVar9 + 1 >> 1) +
                (long)(int)iVar10);
LAB_00136219:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if (*tmp == '\0') {
            cram_stats_add(*(cram_stats **)&s_local[2].last_apos,*(int32_t *)(aux + 0x38));
            *(int *)(aux + 0x3c) = (int)*(undefined8 *)(*(long *)&cr_local[1].apos + 0x30);
            *(int *)(aux + 0x40) =
                 (int)rg - ((int)*(undefined8 *)(*(long *)&cr_local[1].apos + 0x20) +
                           *(int *)(aux + 0x3c));
            *(long *)(*(long *)&cr_local[1].apos + 0x30) =
                 (long)rg - *(long *)(*(long *)&cr_local[1].apos + 0x20);
            if (*(ulong *)(*(long *)&cr_local[1].apos + 0x30) <=
                *(ulong *)(*(long *)&cr_local[1].apos + 0x28)) {
              return _i32;
            }
            __assert_fail("s->aux_blk->byte <= s->aux_blk->alloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_encode.c"
                          ,0x7d3,
                          "char *cram_encode_aux_1_0(cram_fd *, bam_seq_t *, cram_container *, cram_slice *, cram_record *)"
                         );
          }
          if (((*tmp != 'R') || (tmp[1] != 'G')) || (tmp[2] != 'Z')) break;
          _i32 = tmp + 3;
          do {
            pcVar13 = tmp + 1;
            cVar3 = *tmp;
            tmp = pcVar13;
          } while (cVar3 != '\0');
        }
        if (((*tmp != 'M') || (tmp[1] != 'D')) || (tmp[2] != 'Z')) break;
        do {
          pcVar13 = tmp + 1;
          cVar3 = *tmp;
          tmp = pcVar13;
        } while (cVar3 != '\0');
      }
      if ((*tmp == 'N') && (tmp[1] == 'M')) break;
      *(int *)(aux + 0x38) = *(int *)(aux + 0x38) + 1;
      type = (int)*tmp << 0x10 | (int)tmp[1] << 8 | (int)tmp[2];
      kh_put_s_i2i(*(kh_s_i2i_t **)&s_local[2].cigar_alloc,type,&blen);
      if (blen == -1) {
        return (char *)0x0;
      }
      if (cr_local->aend <= cr_local->ncigar) {
        if (cr_local->aend == 0) {
          local_78 = 0x400;
        }
        else {
          local_78 = cr_local->aend << 1;
        }
        cr_local->aend = local_78;
        pvVar12 = realloc(*(void **)&cr_local->qual,(long)cr_local->aend << 2);
        *(void **)&cr_local->qual = pvVar12;
        if (pvVar12 == (void *)0x0) {
          return (char *)0x0;
        }
      }
      iVar4 = cr_local->ncigar;
      cr_local->ncigar = iVar4 + 1;
      *(int *)(*(long *)&cr_local->qual + (long)iVar4 * 4) = type;
      cram_stats_add(*(cram_stats **)&s_local[1].ref_id,type);
      switch(tmp[2]) {
      case 'A':
      case 'C':
      case 'c':
        *rg = tmp[3];
        rg = rg + 1;
        tmp = tmp + 4;
        break;
      case 'B':
        uVar11 = (uint)tmp[3];
        local_64 = *(int *)(tmp + 4);
        if (uVar11 != 0x43) {
          if (uVar11 == 0x49) {
LAB_00136795:
            local_64 = local_64 << 2;
          }
          else {
            if (uVar11 != 0x53) {
              if (uVar11 == 99) goto LAB_001367c8;
              if ((uVar11 == 0x66) || (uVar11 == 0x69)) goto LAB_00136795;
              if (uVar11 != 0x73) {
                tmp = tmp + 3;
                fprintf(_stderr,"Unknown sub-type \'%c\' for aux type \'B\'\n",(ulong)uVar11);
                return (char *)0x0;
              }
            }
            local_64 = local_64 << 1;
          }
        }
LAB_001367c8:
        cVar3 = (char)local_64;
        if ((local_64 + 5U & 0xffffff80) == 0) {
          *rg = cVar3 + '\x05';
          local_88 = 1;
        }
        else {
          if ((local_64 + 5U & 0xffffc000) == 0) {
            *rg = (byte)((uint)(local_64 + 5) >> 8) | 0x80;
            rg[1] = cVar3 + '\x05';
            local_8c = 2;
          }
          else {
            if ((local_64 + 5U & 0xffe00000) == 0) {
              *rg = (byte)((uint)(local_64 + 5) >> 0x10) | 0xc0;
              rg[1] = (char)((uint)(local_64 + 5) >> 8);
              rg[2] = cVar3 + '\x05';
              local_90 = 3;
            }
            else {
              if ((local_64 + 5U & 0xf0000000) == 0) {
                *rg = (byte)((uint)(local_64 + 5) >> 0x18) | 0xe0;
                rg[1] = (char)((uint)(local_64 + 5) >> 0x10);
                rg[2] = (char)((uint)(local_64 + 5) >> 8);
                rg[3] = cVar3 + '\x05';
                local_94 = 4;
              }
              else {
                *rg = (byte)(local_64 + 5 >> 0x1c) | 0xf0;
                rg[1] = (char)(local_64 + 5 >> 0x14);
                rg[2] = (char)(local_64 + 5 >> 0xc);
                rg[3] = (char)(local_64 + 5 >> 4);
                rg[4] = cVar3 + 5U & 0xf;
                local_94 = 5;
              }
              local_90 = local_94;
            }
            local_8c = local_90;
          }
          local_88 = local_8c;
        }
        pcVar13 = rg + local_88;
        *pcVar13 = tmp[3];
        pcVar13[1] = tmp[4];
        pcVar13[2] = tmp[5];
        pcVar14 = tmp + 7;
        pcVar13[3] = tmp[6];
        tmp = tmp + 8;
        rg = pcVar13 + 5;
        pcVar13[4] = *pcVar14;
        memcpy(rg,tmp,(long)local_64);
        rg = rg + local_64;
        tmp = tmp + local_64;
        break;
      default:
        fprintf(_stderr,"Unknown aux type \'%c\'\n",(ulong)(uint)(int)tmp[2]);
        return (char *)0x0;
      case 'H':
      case 'Z':
        pcVar13 = rg;
        tmp = tmp + 3;
        do {
          rg = pcVar13;
          pcVar14 = tmp + 1;
          cVar3 = *tmp;
          pcVar13 = rg + 1;
          *rg = cVar3;
          tmp = pcVar14;
        } while (cVar3 != '\0');
        rg = rg + 2;
        *pcVar13 = '\t';
        break;
      case 'I':
      case 'f':
      case 'i':
        *rg = tmp[3];
        rg[1] = tmp[4];
        rg[2] = tmp[5];
        rg[3] = tmp[6];
        rg = rg + 4;
        tmp = tmp + 7;
        break;
      case 'S':
      case 's':
        *rg = tmp[3];
        rg[1] = tmp[4];
        rg = rg + 2;
        tmp = tmp + 5;
        break;
      case 'd':
        *rg = tmp[3];
        rg[1] = tmp[4];
        rg[2] = tmp[5];
        rg[3] = tmp[6];
        rg[4] = tmp[7];
        rg[5] = tmp[8];
        rg[6] = tmp[9];
        rg[7] = tmp[10];
        rg = rg + 8;
        tmp = tmp + 0xb;
      }
    }
    cVar3 = tmp[2];
    if ((cVar3 != 'A') && (cVar3 != 'C')) {
      if (cVar3 != 'I') {
        if (cVar3 == 'c') goto LAB_0013631b;
        if ((cVar3 != 'f') && (cVar3 != 'i')) {
          fprintf(_stderr,"Unhandled type code for NM tag\n");
          return (char *)0x0;
        }
      }
      tmp = tmp + 7;
      goto LAB_00136219;
    }
LAB_0013631b:
    tmp = tmp + 4;
  } while( true );
}

Assistant:

static char *cram_encode_aux_1_0(cram_fd *fd, bam_seq_t *b, cram_container *c,
				 cram_slice *s, cram_record *cr) {
    char *aux, *tmp, *rg = NULL;
    int aux_size = bam_blk_size(b) -
	((char *)bam_aux(b) - (char *)&bam_ref(b));
	
    /* Worst case is 1 nul char on every ??:Z: string, so +33% */
    BLOCK_GROW(s->aux_blk, aux_size*1.34+1);
    tmp = (char *)BLOCK_END(s->aux_blk);

    aux = (char *)bam_aux(b);
    cr->TN_idx = s->nTN;

    while (aux[0] != 0) {
	int32_t i32;
	int r;

	if (aux[0] == 'R' && aux[1] == 'G' && aux[2] == 'Z') {
	    rg = &aux[3];
	    while (*aux++);
	    continue;
	}
	if (aux[0] == 'M' && aux[1] == 'D' && aux[2] == 'Z') {
	    while (*aux++);
	    continue;
	}
	if (aux[0] == 'N' && aux[1] == 'M') {
	    switch(aux[2]) {
	    case 'A': case 'C': case 'c': aux+=4; break;
	    case 'I': case 'i': case 'f': aux+=7; break;
	    default:
		fprintf(stderr, "Unhandled type code for NM tag\n");
		return NULL;
	    }
	    continue;
	}

	cr->ntags++;

	i32 = (aux[0]<<16) | (aux[1]<<8) | aux[2];
	kh_put(s_i2i, c->tags_used, i32, &r);
	if (-1 == r)
	    return NULL;

	if (s->nTN >= s->aTN) {
	    s->aTN = s->aTN ? s->aTN*2 : 1024;
	    if (!(s->TN = realloc(s->TN, s->aTN * sizeof(*s->TN))))
		return NULL;
	}
	s->TN[s->nTN++] = i32;
	cram_stats_add(c->stats[DS_TN], i32);

	switch(aux[2]) {
	case 'A': case 'C': case 'c':
	    aux+=3; //*tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    *tmp++=*aux++;
	    break;

	case 'S': case 's':
	    aux+=3; //*tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    *tmp++=*aux++; *tmp++=*aux++;
	    break;

	case 'I': case 'i': case 'f':
	    aux+=3; //*tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    break;

	case 'd':
	    aux+=3; //*tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    break;

	case 'Z': case 'H':
	    aux+=3; //*tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;
	    while ((*tmp++=*aux++));
	    *tmp++ = '\t'; // stop byte
	    break;

	case 'B': {
	    int type = aux[3], blen;
	    uint32_t count = (uint32_t)((((unsigned char *)aux)[4]<< 0) +
					(((unsigned char *)aux)[5]<< 8) +
					(((unsigned char *)aux)[6]<<16) +
					(((unsigned char *)aux)[7]<<24));
	    // skip TN field
	    aux+=3; //*tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;

	    // We use BYTE_ARRAY_LEN with external length, so store that first
	    switch (type) {
	    case 'c': case 'C':
		blen = count;
		break;
	    case 's': case 'S':
		blen = 2*count;
		break;
	    case 'i': case 'I': case 'f':
		blen = 4*count;
		break;
	    default:
		fprintf(stderr, "Unknown sub-type '%c' for aux type 'B'\n",
			type);
		return NULL;
		    
	    }

	    tmp += itf8_put(tmp, blen+5);

	    *tmp++=*aux++; // sub-type & length
	    *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++; *tmp++=*aux++;

	    // The tag data itself
	    memcpy(tmp, aux, blen); tmp += blen; aux += blen;

	    //cram_stats_add(c->aux_B_stats, blen);
	    break;
	}
	default:
	    fprintf(stderr, "Unknown aux type '%c'\n", aux[2]);
	    return NULL;
	}
    }
    cram_stats_add(c->stats[DS_TC], cr->ntags);

    cr->aux = BLOCK_SIZE(s->aux_blk);
    cr->aux_size = (uc *)tmp - (BLOCK_DATA(s->aux_blk) + cr->aux);
    BLOCK_SIZE(s->aux_blk) = (uc *)tmp - BLOCK_DATA(s->aux_blk);
    assert(s->aux_blk->byte <= s->aux_blk->alloc);

    return rg;
}